

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac.c
# Opt level: O0

int qrfac_cvkit(integer *m,integer *n,doublereal *a,integer *lda,logical *pivot,integer *ipvt,
               integer *lipvt,doublereal *rdiag,doublereal *acnorm,doublereal *wa)

{
  double *pdVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *in_RCX;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  long in_R9;
  doublereal dVar11;
  doublereal dVar12;
  double dVar13;
  long in_stack_00000010;
  doublereal sum;
  integer jp1;
  doublereal ajnorm;
  doublereal epsmch;
  integer minmn;
  integer k;
  integer j;
  integer i__;
  doublereal temp;
  integer kmax;
  doublereal d__3;
  doublereal d__2;
  doublereal d__1;
  integer i__3;
  integer i__2;
  integer i__1;
  integer a_offset;
  integer a_dim1;
  doublereal *local_d0;
  long local_c8;
  doublereal local_c0;
  double local_b0;
  long local_98;
  long local_90;
  long local_88;
  long local_78;
  doublereal *in_stack_ffffffffffffff98;
  integer *in_stack_ffffffffffffffa0;
  
  lVar4 = jp1 + -8;
  lVar5 = in_stack_00000010 + -8;
  lVar3 = *in_RCX;
  lVar6 = in_RDX + (lVar3 + 1) * -8;
  lVar7 = in_R9 + -8;
  dVar11 = dpmpar_cvkit(&c__1);
  lVar9 = *in_RSI;
  for (local_90 = 1; local_90 <= lVar9; local_90 = local_90 + 1) {
    dVar12 = enorm_cvkit(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *(doublereal *)((long)sum + -8 + local_90 * 8) = dVar12;
    *(undefined8 *)(lVar5 + local_90 * 8) = *(undefined8 *)((long)sum + -8 + local_90 * 8);
    *(undefined8 *)(lVar4 + local_90 * 8) = *(undefined8 *)(lVar5 + local_90 * 8);
    if (*in_R8 != 0) {
      *(long *)(lVar7 + local_90 * 8) = local_90;
    }
  }
  if (*in_RSI < *in_RDI) {
    local_c8 = *in_RSI;
  }
  else {
    local_c8 = *in_RDI;
  }
  for (local_90 = 1; local_90 <= local_c8; local_90 = local_90 + 1) {
    if (*in_R8 != 0) {
      local_78 = local_90;
      for (local_98 = local_90; local_98 <= *in_RSI; local_98 = local_98 + 1) {
        dVar13 = *(double *)(lVar5 + local_98 * 8);
        pdVar1 = (double *)(lVar5 + local_78 * 8);
        if (*pdVar1 <= dVar13 && dVar13 != *pdVar1) {
          local_78 = local_98;
        }
      }
      if (local_78 != local_90) {
        lVar9 = *in_RDI;
        for (local_88 = 1; local_88 <= lVar9; local_88 = local_88 + 1) {
          uVar2 = *(undefined8 *)(lVar6 + (local_88 + local_90 * lVar3) * 8);
          *(undefined8 *)(lVar6 + (local_88 + local_90 * lVar3) * 8) =
               *(undefined8 *)(lVar6 + (local_88 + local_78 * lVar3) * 8);
          *(undefined8 *)(lVar6 + (local_88 + local_78 * lVar3) * 8) = uVar2;
        }
        *(undefined8 *)(lVar5 + local_78 * 8) = *(undefined8 *)(lVar5 + local_90 * 8);
        *(undefined8 *)(lVar4 + local_78 * 8) = *(undefined8 *)(lVar4 + local_90 * 8);
        uVar2 = *(undefined8 *)(lVar7 + local_90 * 8);
        *(undefined8 *)(lVar7 + local_90 * 8) = *(undefined8 *)(lVar7 + local_78 * 8);
        *(undefined8 *)(lVar7 + local_78 * 8) = uVar2;
      }
    }
    local_b0 = enorm_cvkit(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((local_b0 != qrfac_cvkit::zero) || (NAN(local_b0) || NAN(qrfac_cvkit::zero))) {
      if (*(double *)(lVar6 + (local_90 + local_90 * lVar3) * 8) < qrfac_cvkit::zero) {
        local_b0 = -local_b0;
      }
      lVar9 = *in_RDI;
      for (local_88 = local_90; local_88 <= lVar9; local_88 = local_88 + 1) {
        lVar8 = local_88 + local_90 * lVar3;
        *(double *)(lVar6 + lVar8 * 8) = *(double *)(lVar6 + lVar8 * 8) / local_b0;
      }
      lVar9 = local_90 + local_90 * lVar3;
      *(double *)(lVar6 + lVar9 * 8) = qrfac_cvkit::one + *(double *)(lVar6 + lVar9 * 8);
      local_98 = local_90 + 1;
      if (local_98 <= *in_RSI) {
        lVar9 = *in_RSI;
        for (; local_98 <= lVar9; local_98 = local_98 + 1) {
          local_c0 = qrfac_cvkit::zero;
          for (local_88 = local_90; local_88 <= *in_RDI; local_88 = local_88 + 1) {
            local_c0 = *(double *)(lVar6 + (local_88 + local_90 * lVar3) * 8) *
                       *(double *)(lVar6 + (local_88 + local_98 * lVar3) * 8) + local_c0;
          }
          dVar13 = *(double *)(lVar6 + (local_90 + local_90 * lVar3) * 8);
          lVar8 = *in_RDI;
          for (local_88 = local_90; local_88 <= lVar8; local_88 = local_88 + 1) {
            lVar10 = local_88 + local_98 * lVar3;
            *(double *)(lVar6 + lVar10 * 8) =
                 -(local_c0 / dVar13) * *(double *)(lVar6 + (local_88 + local_90 * lVar3) * 8) +
                 *(double *)(lVar6 + lVar10 * 8);
          }
          if (*in_R8 != 0) {
            dVar13 = *(double *)(lVar5 + local_98 * 8);
            if ((dVar13 != qrfac_cvkit::zero) || (NAN(dVar13) || NAN(qrfac_cvkit::zero))) {
              dVar13 = *(double *)(lVar6 + (local_90 + local_98 * lVar3) * 8) /
                       *(double *)(lVar5 + local_98 * 8);
              in_stack_ffffffffffffff98 = (doublereal *)(-dVar13 * dVar13 + qrfac_cvkit::one);
              local_d0 = in_stack_ffffffffffffff98;
              if ((double)in_stack_ffffffffffffff98 <= qrfac_cvkit::zero) {
                local_d0 = (doublereal *)qrfac_cvkit::zero;
              }
              dVar13 = sqrt((double)local_d0);
              *(double *)(lVar5 + local_98 * 8) = dVar13 * *(double *)(lVar5 + local_98 * 8);
              in_stack_ffffffffffffffa0 =
                   (integer *)
                   (*(double *)(lVar5 + local_98 * 8) / *(double *)(lVar4 + local_98 * 8));
              if (qrfac_cvkit::p05 *
                  (double)in_stack_ffffffffffffffa0 * (double)in_stack_ffffffffffffffa0 <= dVar11) {
                dVar12 = enorm_cvkit(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
                *(doublereal *)(lVar5 + local_98 * 8) = dVar12;
                *(undefined8 *)(lVar4 + local_98 * 8) = *(undefined8 *)(lVar5 + local_98 * 8);
              }
            }
          }
        }
      }
    }
    *(double *)(lVar5 + local_90 * 8) = -local_b0;
  }
  return 0;
}

Assistant:

int qrfac_cvkit(integer *m, integer *n, doublereal *a, integer *
	lda, logical *pivot, integer *ipvt, integer *lipvt, doublereal *rdiag,
	 doublereal *acnorm, doublereal *wa)
{
    /* Initialized data */

    static doublereal one = 1.;
    static doublereal p05 = .05;
    static doublereal zero = 0.;

    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3;
    doublereal d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    integer kmax;
    doublereal temp;
    integer i__, j, k, minmn;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal epsmch;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal ajnorm;
    integer jp1;
    doublereal sum;

/*<       integer m,n,lda,lipvt >*/
/*<       integer ipvt(lipvt) >*/
/*<       logical pivot >*/
/*<       double precision a(lda,n),rdiag(n),acnorm(n),wa(n) >*/
/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,j,jp1,k,kmax,minmn >*/
/*<       double precision ajnorm,epsmch,one,p05,sum,temp,zero >*/
/*<       double precision dpmpar,enorm >*/
/*<       data one,p05,zero /1.0d0,5.0d-2,0.0d0/ >*/
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

/*<       epsmch = dpmpar(1) >*/
    epsmch = dpmpar_cvkit(&c__1);

/*     compute the initial column norms and initialize several arrays. */

/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          acnorm(j) = enorm(m,a(1,j)) >*/
	acnorm[j] = enorm_cvkit(m, &a[j * a_dim1 + 1]);
/*<          rdiag(j) = acnorm(j) >*/
	rdiag[j] = acnorm[j];
/*<          wa(j) = rdiag(j) >*/
	wa[j] = rdiag[j];
/*<          if (pivot) ipvt(j) = j >*/
	if (*pivot) {
	    ipvt[j] = j;
	}
/*<    10    continue >*/
/* L10: */
    }

/*     reduce a to r with householder transformations. */

/*<       minmn = min0(m,n) >*/
    minmn = min(*m,*n);
/*<       do 110 j = 1, minmn >*/
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
/*<          if (.not.pivot) go to 40 >*/
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

/*<          kmax = j >*/
	kmax = j;
/*<          do 20 k = j, n >*/
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
/*<             if (rdiag(k) .gt. rdiag(kmax)) kmax = k >*/
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/*<    20       continue >*/
/* L20: */
	}
/*<          if (kmax .eq. j) go to 40 >*/
	if (kmax == j) {
	    goto L40;
	}
/*<          do 30 i = 1, m >*/
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             temp = a(i,j) >*/
	    temp = a[i__ + j * a_dim1];
/*<             a(i,j) = a(i,kmax) >*/
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
/*<             a(i,kmax) = temp >*/
	    a[i__ + kmax * a_dim1] = temp;
/*<    30       continue >*/
/* L30: */
	}
/*<          rdiag(kmax) = rdiag(j) >*/
	rdiag[kmax] = rdiag[j];
/*<          wa(kmax) = wa(j) >*/
	wa[kmax] = wa[j];
/*<          k = ipvt(j) >*/
	k = ipvt[j];
/*<          ipvt(j) = ipvt(kmax) >*/
	ipvt[j] = ipvt[kmax];
/*<          ipvt(kmax) = k >*/
	ipvt[kmax] = k;
/*<    40    continue >*/
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

/*<          ajnorm = enorm(m-j+1,a(j,j)) >*/
	i__2 = *m - j + 1;
	ajnorm = enorm_cvkit(&i__2, &a[j + j * a_dim1]);
/*<          if (ajnorm .eq. zero) go to 100 >*/
	if (ajnorm == zero) {
	    goto L100;
	}
/*<          if (a(j,j) .lt. zero) ajnorm = -ajnorm >*/
	if (a[j + j * a_dim1] < zero) {
	    ajnorm = -ajnorm;
	}
/*<          do 50 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<             a(i,j) = a(i,j)/ajnorm >*/
	    a[i__ + j * a_dim1] /= ajnorm;
/*<    50       continue >*/
/* L50: */
	}
/*<          a(j,j) = a(j,j) + one >*/
	a[j + j * a_dim1] += one;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

/*<          jp1 = j + 1 >*/
	jp1 = j + 1;
/*<          if (n .lt. jp1) go to 100 >*/
	if (*n < jp1) {
	    goto L100;
	}
/*<          do 90 k = jp1, n >*/
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
/*<             sum = zero >*/
	    sum = zero;
/*<             do 60 i = j, m >*/
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
/*<                sum = sum + a(i,j)*a(i,k) >*/
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/*<    60          continue >*/
/* L60: */
	    }
/*<             temp = sum/a(j,j) >*/
	    temp = sum / a[j + j * a_dim1];
/*<             do 70 i = j, m >*/
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
/*<                a(i,k) = a(i,k) - temp*a(i,j) >*/
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/*<    70          continue >*/
/* L70: */
	    }
/*<             if (.not.pivot .or. rdiag(k) .eq. zero) go to 80 >*/
	    if (! (*pivot) || rdiag[k] == zero) {
		goto L80;
	    }
/*<             temp = a(j,k)/rdiag(k) >*/
	    temp = a[j + k * a_dim1] / rdiag[k];
/*<             rdiag(k) = rdiag(k)*dsqrt(dmax1(zero,one-temp**2)) >*/
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = zero, d__2 = one - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/*<             if (p05*(rdiag(k)/wa(k))**2 .gt. epsmch) go to 80 >*/
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
/*<             rdiag(k) = enorm(m-j,a(jp1,k)) >*/
	    i__3 = *m - j;
	    rdiag[k] = enorm_cvkit(&i__3, &a[jp1 + k * a_dim1]);
/*<             wa(k) = rdiag(k) >*/
	    wa[k] = rdiag[k];
/*<    80       continue >*/
L80:
/*<    90       continue >*/
/* L90: */
	    ;
	}
/*<   100    continue >*/
L100:
/*<          rdiag(j) = -ajnorm >*/
	rdiag[j] = -ajnorm;
/*<   110    continue >*/
/* L110: */
    }
/*<       return >*/
    return 0;

/*     last card of subroutine qrfac. */

/*<       end >*/
}